

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_setop.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundSetOperationNode *node)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  shared_ptr<duckdb::Binder,_true> *this_01;
  bool bVar1;
  byte bVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  undefined8 uVar4;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var5;
  __uniq_ptr_impl<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>_> _Var6;
  LogicalOperatorType type;
  Binder *pBVar7;
  reference pvVar8;
  pointer pEVar9;
  idx_t iVar10;
  tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_> this_02;
  pointer pLVar11;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var12;
  pointer pBVar13;
  LogicalSetOperation *this_03;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  undefined1 uVar14;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> node_00;
  idx_t i;
  size_type __n;
  undefined1 local_e8 [16];
  undefined1 local_d8 [56];
  __node_base_ptr local_a0;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_98;
  __uniq_ptr_impl<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>_>
  local_90;
  vector<duckdb::LogicalType,_true> left_types;
  vector<duckdb::LogicalType,_true> right_types;
  
  bVar1 = *(bool *)((long)&node[2].super_BoundQueryNode.names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1);
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0xf);
  pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  pBVar7->is_outside_flattened = bVar1;
  bVar1 = *(bool *)((long)&node[2].super_BoundQueryNode.names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1);
  this_01 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x11);
  pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  pBVar7->is_outside_flattened = bVar1;
  pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0xc));
  CreatePlan((Binder *)(local_e8 + 8),(BoundQueryNode *)pBVar7);
  pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0xd));
  CreatePlan((Binder *)local_e8,(BoundQueryNode *)pBVar7);
  if (in_RDX[0x13].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
      in_RDX[0x14].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
    pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)(in_RDX + 0xc));
    local_d8._40_8_ = local_e8._8_8_;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)local_d8,(vector<duckdb::LogicalType,_true> *)node,&pBVar13->types,
               in_RDX + 8);
    uVar4 = local_e8._8_8_;
    local_e8._8_8_ = local_d8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)uVar4)[1])();
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_d8._40_8_)[1]._M_nxt)();
    }
    local_d8._40_8_ = (_Hash_node_base *)0x0;
    pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)(in_RDX + 0xd));
    local_d8._32_8_ = local_e8._0_8_;
    local_e8._0_8_ = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)local_d8,(vector<duckdb::LogicalType,_true> *)node,&pBVar13->types,
               in_RDX + 8);
    uVar4 = local_e8._0_8_;
    local_e8._0_8_ = local_d8._0_8_;
    if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
        uVar4 != (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )0x0) {
      (**(code **)(*(long *)uVar4 + 8))();
    }
    if ((element_type *)local_d8._32_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_d8._32_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_d8._32_8_ = 0;
  }
  else {
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = 0;
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)(in_RDX + 0x13),__n);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&left_types,
                 &pEVar9->return_type);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)(in_RDX + 0x16),__n);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&right_types,
                 &pEVar9->return_type);
      __n = __n + 1;
    } while (__n < (ulong)((long)in_RDX[0x14].
                                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                 _M_head_impl -
                           (long)in_RDX[0x13].
                                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                 _M_head_impl >> 3));
    iVar10 = GenerateTableIndex((Binder *)node);
    this_02.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
          )operator_new(0x70);
    local_d8._0_8_ =
         in_RDX[0x13].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._8_8_ =
         in_RDX[0x14].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._16_8_ =
         in_RDX[0x15].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
       *)(in_RDX + 0x13))->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    in_RDX[0x14].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    in_RDX[0x15].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalProjection::LogicalProjection
              ((LogicalProjection *)
               this_02.
               super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
               .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl,iVar10,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_d8);
    local_90._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         this_02.
         super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
         .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_d8);
    pLVar11 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_90);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar11->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)(local_e8 + 8));
    _Var6._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         local_90._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
         .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl;
    uVar4 = local_e8._8_8_;
    local_90._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
          )0x0;
    local_e8._8_8_ =
         _Var6._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
         .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)uVar4)[1])();
    }
    iVar10 = GenerateTableIndex((Binder *)node);
    _Var12._M_head_impl = (LogicalOperator *)operator_new(0x70);
    local_d8._0_8_ =
         in_RDX[0x16].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._8_8_ =
         in_RDX[0x17].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._16_8_ =
         in_RDX[0x18].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    in_RDX[0x16].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    in_RDX[0x17].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    in_RDX[0x18].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalProjection::LogicalProjection
              ((LogicalProjection *)_Var12._M_head_impl,iVar10,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_d8);
    local_98._M_head_impl = (LogicalProjection *)_Var12._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_d8);
    pLVar11 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_98);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar11->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_e8);
    _Var5._M_head_impl = local_98._M_head_impl;
    uVar4 = local_e8._0_8_;
    local_98._M_head_impl = (LogicalProjection *)0x0;
    local_e8._0_8_ = _Var5._M_head_impl;
    if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar4 !=
        (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)uVar4)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_a0 = (__node_base_ptr)local_e8._8_8_;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)local_d8,(vector<duckdb::LogicalType,_true> *)node,&left_types,in_RDX + 8);
    uVar4 = local_e8._8_8_;
    local_e8._8_8_ = local_d8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)uVar4)[1])();
    }
    if ((LogicalProjection *)local_a0 != (LogicalProjection *)0x0) {
      (*((LogicalOperator *)&local_a0->_M_nxt)->_vptr_LogicalOperator[1])();
    }
    local_a0 = (__node_base_ptr)0x0;
    local_d8._48_8_ = local_e8._0_8_;
    local_e8._0_8_ = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)local_d8,(vector<duckdb::LogicalType,_true> *)node,&right_types,in_RDX + 8)
    ;
    uVar4 = local_e8._0_8_;
    local_e8._0_8_ = local_d8._0_8_;
    if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
        uVar4 != (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )0x0) {
      (**(code **)(*(long *)uVar4 + 8))();
    }
    if ((element_type *)local_d8._48_8_ != (element_type *)0x0) {
      (*((LogicalOperator *)local_d8._48_8_)->_vptr_LogicalOperator[1])();
    }
    local_d8._48_8_ = 0;
    if (local_98._M_head_impl != (LogicalProjection *)0x0) {
      (*(code *)((__node_base_ptr)
                ((local_98._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)[1]._M_nxt)()
      ;
    }
    if (local_90._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
        .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
         )0x0) {
      (**(code **)(*(long *)local_90._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
                            .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl
                  + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&right_types);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&left_types);
  }
  uVar14 = 1;
  if (*(char *)&node[2].super_BoundQueryNode.names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == '\0') {
    pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    if (pBVar7->has_unplanned_dependent_joins == false) {
      pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
      uVar14 = pBVar7->has_unplanned_dependent_joins;
    }
  }
  *(undefined1 *)
   &node[2].super_BoundQueryNode.names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = uVar14;
  bVar2 = *(byte *)&in_RDX[0xb].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var12._M_head_impl =
       in_RDX[8].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var3._M_head_impl =
       in_RDX[9].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  this_03 = (LogicalSetOperation *)operator_new(0x80);
  type = (LogicalOperatorType)(0x4b4d4c4b00 >> (bVar2 * '\b' & 0x3f));
  if (4 < bVar2) {
    type = LOGICAL_INVALID;
  }
  node_00._M_head_impl =
       in_RDX[0xe].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_d8._0_8_ = local_e8._8_8_;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
  local_e8._0_8_ =
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  LogicalSetOperation::LogicalSetOperation
            (this_03,(idx_t)node_00._M_head_impl,
             ((long)_Var3._M_head_impl - (long)_Var12._M_head_impl >> 3) * -0x5555555555555555,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)local_d8,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&left_types,type,
             *(bool *)((long)&in_RDX[0xb].
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                      + 1),true);
  if (left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)left_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((LogicalOperator *)local_d8._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_d8._0_8_ + 8))();
  }
  local_d8._24_8_ = this_03;
  VisitQueryNode(this,(BoundQueryNode *)node_00._M_head_impl,in_RDX);
  if ((LogicalSetOperation *)local_d8._24_8_ != (LogicalSetOperation *)0x0) {
    (*((LogicalOperator *)local_d8._24_8_)->_vptr_LogicalOperator[1])();
  }
  local_d8._24_8_ = (_Hash_node_base *)0x0;
  if ((LogicalOperator *)local_e8._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_e8._0_8_ + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_e8._8_8_)[1])();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundSetOperationNode &node) {
	// Generate the logical plan for the left and right sides of the set operation
	node.left_binder->is_outside_flattened = is_outside_flattened;
	node.right_binder->is_outside_flattened = is_outside_flattened;

	auto left_node = node.left_binder->CreatePlan(*node.left);
	auto right_node = node.right_binder->CreatePlan(*node.right);

	// Add a new projection to child node
	D_ASSERT(node.left_reorder_exprs.size() == node.right_reorder_exprs.size());
	if (!node.left_reorder_exprs.empty()) {
		D_ASSERT(node.setop_type == SetOperationType::UNION_BY_NAME);
		vector<LogicalType> left_types;
		vector<LogicalType> right_types;
		// We are going to add a new projection operator, so collect the type
		// of reorder exprs in order to call CastLogicalOperatorToTypes()
		for (idx_t i = 0; i < node.left_reorder_exprs.size(); ++i) {
			left_types.push_back(node.left_reorder_exprs[i]->return_type);
			right_types.push_back(node.right_reorder_exprs[i]->return_type);
		}

		auto left_projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(node.left_reorder_exprs));
		left_projection->children.push_back(std::move(left_node));
		left_node = std::move(left_projection);

		auto right_projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(node.right_reorder_exprs));
		right_projection->children.push_back(std::move(right_node));
		right_node = std::move(right_projection);

		left_node = CastLogicalOperatorToTypes(left_types, node.types, std::move(left_node));
		right_node = CastLogicalOperatorToTypes(right_types, node.types, std::move(right_node));
	} else {
		left_node = CastLogicalOperatorToTypes(node.left->types, node.types, std::move(left_node));
		right_node = CastLogicalOperatorToTypes(node.right->types, node.types, std::move(right_node));
	}

	// check if there are any unplanned subqueries left in either child
	has_unplanned_dependent_joins = has_unplanned_dependent_joins || node.left_binder->has_unplanned_dependent_joins ||
	                                node.right_binder->has_unplanned_dependent_joins;

	// create actual logical ops for setops
	LogicalOperatorType logical_type = LogicalOperatorType::LOGICAL_INVALID;
	switch (node.setop_type) {
	case SetOperationType::UNION:
	case SetOperationType::UNION_BY_NAME:
		logical_type = LogicalOperatorType::LOGICAL_UNION;
		break;
	case SetOperationType::EXCEPT:
		logical_type = LogicalOperatorType::LOGICAL_EXCEPT;
		break;
	case SetOperationType::INTERSECT:
		logical_type = LogicalOperatorType::LOGICAL_INTERSECT;
		break;
	default:
		D_ASSERT(false);
		break;
	}

	auto root = make_uniq<LogicalSetOperation>(node.setop_index, node.types.size(), std::move(left_node),
	                                           std::move(right_node), logical_type, node.setop_all);

	return VisitQueryNode(node, std::move(root));
}